

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O2

wchar_t __thiscall Centaurus::Stream::skip_whitespace(Stream *this)

{
  wchar_t *pwVar1;
  int iVar2;
  wchar_t wVar3;
  
  while( true ) {
    while( true ) {
      pwVar1 = (this->m_cur)._M_current;
      if (pwVar1 == (this->m_str)._M_dataplus._M_p + (this->m_str)._M_string_length) {
        wVar3 = L'\0';
      }
      else {
        wVar3 = *pwVar1;
      }
      iVar2 = iswspace(wVar3);
      if (iVar2 == 0) break;
      get(this);
    }
    if (wVar3 != L'/') break;
    wVar3 = peek(this,2);
    if (wVar3 == L'/') {
      discard(this,2);
      skip_oneline_comment(this);
    }
    else {
      if (wVar3 != L'*') {
        return L'/';
      }
      discard(this,2);
      skip_multiline_comment(this);
    }
  }
  return wVar3;
}

Assistant:

wchar_t skip_whitespace()
    {
        wchar_t ch;

        while (true)
        {
            ch = peek();

            if (std::iswspace(ch))
            {
                discard();
            }
            else if (ch == L'/')
            {
                ch = peek(2);
                if (ch == L'*')
                {
                    discard(2);
                    skip_multiline_comment();
                }
                else if (ch == L'/')
                {
                    discard(2);
                    skip_oneline_comment();
                }
                else
                {
                    return L'/';
                }
            }
            else
            {
                break;
            }
        }
        return ch;
    }